

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcursor.cpp
# Opt level: O0

void QCursor::setPos(QScreen *screen,int x,int y)

{
  bool bVar1;
  int iVar2;
  QPlatformScreen *pQVar3;
  undefined4 extraout_var;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  QPlatformCursor *cursor;
  QPoint in_stack_00000028;
  QPoint devicePos;
  QPoint pos;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  QScreen *in_stack_ffffffffffffffc0;
  QScreen *in_stack_ffffffffffffffd8;
  QPoint local_18;
  undefined1 *local_10;
  long local_8;
  QPoint *this;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI != 0) {
    pQVar3 = QScreen::handle(in_stack_ffffffffffffffc0);
    iVar2 = (*pQVar3->_vptr_QPlatformScreen[0x16])();
    this = (QPoint *)CONCAT44(extraout_var,iVar2);
    if (this != (QPoint *)0x0) {
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QPoint::QPoint(this,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      local_18 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      QScreen::virtualSiblingAt(in_stack_ffffffffffffffd8,in_stack_00000028);
      local_18 = QHighDpi::toNativePixels<QPoint,QScreen>
                           ((QPoint *)CONCAT44(in_ESI,in_EDX),(QScreen *)this);
      (**(code **)((long)*this + 0x80))();
      bVar1 = ::operator!=(this,(QPoint *)
                                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (bVar1) {
        (**(code **)((long)*this + 0x88))(this,&local_18);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCursor::setPos(QScreen *screen, int x, int y)
{
    if (screen) {
        if (QPlatformCursor *cursor = screen->handle()->cursor()) {
            const QPoint pos(x, y);
            const QPoint devicePos = QHighDpi::toNativePixels(pos, screen->virtualSiblingAt(pos));
            // Need to check, since some X servers generate null mouse move
            // events, causing looping in applications which call setPos() on
            // every mouse move event.
            if (devicePos != cursor->pos())
                cursor->setPos(devicePos);
        }
    }
}